

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::
         StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
         ::convert(string *__return_storage_ptr__,wstring *wstr)

{
  undefined8 this;
  bool bVar1;
  size_type __res;
  reference pwVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  char local_81;
  const_iterator cStack_60;
  wchar_t c;
  const_iterator __end1;
  const_iterator __begin1;
  wstring *__range1;
  undefined1 local_38 [8];
  string s;
  wstring *wstr_local;
  
  s.field_2._8_8_ = wstr;
  std::__cxx11::string::string((string *)local_38);
  __res = clara::std::__cxx11::
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::size
                    ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     s.field_2._8_8_);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__res);
  this = s.field_2._8_8_;
  __end1 = clara::std::__cxx11::
           basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::begin
                     ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      s.field_2._8_8_);
  cStack_60 = clara::std::__cxx11::
              basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::end
                        ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      (&__end1,&stack0xffffffffffffffa0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pwVar2 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&__end1);
    if (*pwVar2 < L'Ā') {
      local_81 = (char)*pwVar2;
    }
    else {
      local_81 = '?';
    }
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               local_81);
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&__end1);
  }
  Detail::stringify<std::__cxx11::string>(__return_storage_ptr__,(Detail *)local_38,e);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::wstring>::convert(const std::wstring& wstr) {
    std::string s;
    s.reserve(wstr.size());
    for (auto c : wstr) {
        s += (c <= 0xff) ? static_cast<char>(c) : '?';
    }
    return ::Catch::Detail::stringify(s);
}